

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManFindUnatePairs
               (word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
               Vec_Int_t **vUnatePairs,int fVerbose)

{
  int iVar1;
  int iVar2;
  int nBefore;
  int RetValue;
  int n;
  int fVerbose_local;
  Vec_Int_t **vUnatePairs_local;
  Vec_Int_t *vBinateVars_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word **pSets_local;
  
  if (fVerbose != 0) {
    printf("  ");
  }
  for (nBefore = 0; nBefore < 2; nBefore = nBefore + 1) {
    iVar1 = Vec_IntSize(vUnatePairs[nBefore]);
    Gia_ManFindUnatePairsInt
              (pSets[nBefore],pSets[(int)(uint)((nBefore != 0 ^ 0xffU) & 1)],vBinateVars,vDivs,
               nWords,vUnatePairs[nBefore]);
    if (fVerbose != 0) {
      iVar2 = Vec_IntSize(vUnatePairs[nBefore]);
      printf("UP%d =%5d ",(ulong)(uint)nBefore,(ulong)(uint)(iVar2 - iVar1));
    }
  }
  iVar1 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],fVerbose);
  if (iVar1 == -1) {
    return;
  }
  __assert_fail("RetValue == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x369,
                "void Gia_ManFindUnatePairs(word **, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t **, int)"
               );
}

Assistant:

void Gia_ManFindUnatePairs( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n, RetValue;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        int nBefore = Vec_IntSize(vUnatePairs[n]);
        Gia_ManFindUnatePairsInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UP%d =%5d ", n, Vec_IntSize(vUnatePairs[n])-nBefore );
    }
    RetValue = Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
    assert( RetValue == -1 );
}